

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O3

size_t MuxImageDiskSize(WebPMuxImage *wpi)

{
  size_t size;
  size_t sVar1;
  WebPChunk *pWVar2;
  long lVar3;
  
  if (wpi->header_ == (WebPChunk *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = (ulong)((int)(wpi->header_->data_).size + 1U & 0xfffffffe) + 8;
  }
  if (wpi->alpha_ != (WebPChunk *)0x0) {
    sVar1 = sVar1 + ((int)(wpi->alpha_->data_).size + 1U & 0xfffffffe) + 8;
  }
  if (wpi->img_ != (WebPChunk *)0x0) {
    sVar1 = sVar1 + ((int)(wpi->img_->data_).size + 1U & 0xfffffffe) + 8;
  }
  pWVar2 = wpi->unknown_;
  if (pWVar2 != (WebPChunk *)0x0) {
    lVar3 = 0;
    do {
      lVar3 = lVar3 + (ulong)((int)(pWVar2->data_).size + 1U & 0xfffffffe) + 8;
      pWVar2 = pWVar2->next_;
    } while (pWVar2 != (WebPChunk *)0x0);
    sVar1 = sVar1 + lVar3;
  }
  return sVar1;
}

Assistant:

size_t MuxImageDiskSize(const WebPMuxImage* const wpi) {
  size_t size = 0;
  if (wpi->header_ != NULL) size += ChunkDiskSize(wpi->header_);
  if (wpi->alpha_ != NULL) size += ChunkDiskSize(wpi->alpha_);
  if (wpi->img_ != NULL) size += ChunkDiskSize(wpi->img_);
  if (wpi->unknown_ != NULL) size += ChunkListDiskSize(wpi->unknown_);
  return size;
}